

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_conn.cpp
# Opt level: O1

ssize_t __thiscall
TcpConnection::send(TcpConnection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var_00;
  int *piVar3;
  undefined4 extraout_var_01;
  uint7 extraout_var;
  undefined4 in_register_00000034;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  iVar1 = BufferBase::length(&(this->tc_obuf).super_BufferBase);
  iVar2 = OutputBuffer::write2buf
                    (&this->tc_obuf,(char *)CONCAT44(in_register_00000034,__fd),(int)__buf);
  piVar3 = (int *)CONCAT44(extraout_var_00,iVar2);
  if (iVar2 == 0) {
    if (iVar1 == 0) {
      local_48._8_8_ = 0;
      pcStack_30 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tcp_conn.cpp:73:48)>
                   ::_M_invoke;
      local_38 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tcp_conn.cpp:73:48)>
                 ::_M_manager;
      local_48._M_unused._M_object = this;
      Epoll::epoll_add((this->tc_loop->el_epoller).
                       super___shared_ptr<Epoll,_(__gnu_cxx::_Lock_policy)2>._M_ptr,this->tc_fd,4,
                       (EventCallback *)&local_48);
      piVar3 = (int *)local_38;
      if (local_38 != (code *)0x0) {
        (*local_38)(&local_48,&local_48,__destroy_functor);
        piVar3 = (int *)((ulong)extraout_var << 8);
      }
    }
  }
  else {
    piVar3 = &pr_level;
    if (-1 < pr_level) {
      iVar1 = printf("[%-5s][%s:%d] send data to output buf error\n","error","send",0x44);
      piVar3 = (int *)CONCAT44(extraout_var_01,iVar1);
    }
  }
  return CONCAT71((int7)((ulong)piVar3 >> 8),iVar2 == 0);
}

Assistant:

bool TcpConnection::send(const char *data, int len) {
    bool should_activate_epollout = false; 
    if(tc_obuf.length() == 0) {
        should_activate_epollout = true;
    }

    if (int ret = tc_obuf.write2buf(data, len); ret != 0) {
        PR_ERROR("send data to output buf error\n");
        return false;
    }

    if (should_activate_epollout == true) {
        tc_loop->add_to_poller(tc_fd,EPOLLOUT, [this](){ this->do_write(); });
    }

    return true;
}